

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O3

bool dxil_spv::emit_cbuffer_load_legacy_instruction(Impl *impl,CallInst *instruction)

{
  Op op;
  bool bVar1;
  TypeID TVar2;
  Id IVar3;
  Id IVar4;
  Id IVar5;
  Builder *this;
  Value *pVVar6;
  mapped_type *pmVar7;
  Type *pTVar8;
  LoggingCallback p_Var9;
  void *pvVar10;
  mapped_type *pmVar11;
  Type *element_type;
  Operation *pOVar12;
  Operation *this_00;
  uint uVar13;
  Id ptr_id;
  Op value_cast_op;
  Id physical_type_id;
  char buffer [4096];
  RawWidth local_1074;
  RawVecSize local_1070;
  int local_106c;
  int local_1068;
  Id local_1064;
  Type *local_1060;
  mapped_type *local_1058;
  uint local_1050;
  Op local_104c;
  Id local_1048;
  Id local_1044;
  Id local_1040;
  Id local_103c;
  initializer_list<unsigned_int> local_1038;
  char local_1028 [4088];
  
  this = Converter::Impl::builder(impl);
  pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  bVar1 = false;
  local_1064 = Converter::Impl::get_id_for_value(impl,pVVar6,0);
  if (local_1064 != 0) {
    if (local_1064 == impl->root_constant_id) {
      bVar1 = emit_cbuffer_load_root_constant(impl,instruction);
      return bVar1;
    }
    pmVar7 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&impl->handle_to_resource_meta,&local_1064);
    pTVar8 = LLVMBC::Value::getType((Value *)instruction);
    TVar2 = LLVMBC::Type::getTypeID(pTVar8);
    if (TVar2 == StructTyID) {
      emit_buffer_synchronization_validation(impl,instruction,Load);
      if (pmVar7->storage == StorageClassShaderRecordBufferKHR) {
        local_1038._M_array =
             (iterator)LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
        pmVar11 = std::__detail::
                  _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&impl->handle_to_root_member_offset,(key_type *)&local_1038);
        bVar1 = emit_cbuffer_load_shader_record(impl,instruction,*pmVar11);
      }
      else {
        if (pmVar7->storage == StorageClassPhysicalStorageBuffer) {
          emit_cbuffer_load_physical_pointer(impl,instruction);
        }
        else {
          local_1058 = pmVar7;
          element_type = LLVMBC::Type::getStructElementType(pTVar8,0);
          local_104c = OpNop;
          local_1048 = 0;
          get_physical_load_store_cast_info(impl,element_type,&local_1048,&local_104c);
          local_1050 = get_type_scalar_alignment(impl,element_type);
          if (local_1050 == 8) {
            local_1070 = V2;
            local_1074 = B64;
            local_106c = 0x40;
            local_1068 = 2;
          }
          else {
            local_1070 = V4;
            local_1074 = B32;
            local_106c = 0x20;
            local_1068 = 4;
          }
          uVar13 = local_1050 ^ 8;
          local_1060 = element_type;
          TVar2 = LLVMBC::Type::getTypeID(element_type);
          local_1064 = get_buffer_alias_handle
                                 (impl,local_1058,local_1064,
                                  (uint)(uVar13 != 0 || (TVar2 ^ IntegerTyID) != Unknown),local_1074
                                  ,local_1070);
          pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
          IVar3 = Converter::Impl::get_id_for_value(impl,pVVar6,0);
          if ((TVar2 ^ IntegerTyID) == Unknown && uVar13 == 0) {
            IVar4 = spv::Builder::makeIntegerType(this,local_106c,false);
          }
          else {
            IVar4 = spv::Builder::makeFloatType(this,local_106c);
          }
          IVar4 = spv::Builder::makeVectorType(this,IVar4,local_1068);
          IVar5 = spv::Builder::makePointer(this,local_1058->storage,IVar4);
          pOVar12 = Converter::Impl::allocate(impl,OpAccessChain,IVar5);
          local_1044 = local_1064;
          IVar5 = spv::Builder::makeIntegerType(this,0x20,false);
          local_1040 = spv::Builder::makeIntConstant(this,IVar5,0,false);
          local_1038._M_len = 3;
          local_103c = IVar3;
          local_1038._M_array = &local_1044;
          Operation::add_ids(pOVar12,&local_1038);
          Converter::Impl::add(impl,pOVar12,false);
          if (local_1058->non_uniform == true) {
            spv::Builder::addDecoration(this,pOVar12->id,DecorationNonUniform,-1);
          }
          pTVar8 = LLVMBC::Type::getStructElementType(pTVar8,0);
          TVar2 = LLVMBC::Type::getTypeID(pTVar8);
          this_00 = Converter::Impl::allocate(impl,OpLoad,(Value *)instruction,IVar4);
          Operation::add_id(this_00,pOVar12->id);
          Converter::Impl::add(impl,this_00,false);
          if (local_1050 == 2) {
            build_bitcast_32x4_to_16x8_composite(impl,instruction,this_00->id);
            pTVar8 = local_1060;
          }
          else {
            pTVar8 = local_1060;
            if ((local_1050 < 8) && (TVar2 == IntegerTyID)) {
              IVar3 = spv::Builder::makeIntegerType(this,local_106c,false);
              IVar3 = spv::Builder::makeVectorType(this,IVar3,local_1068);
              pOVar12 = Converter::Impl::allocate(impl,OpBitcast,IVar3);
              Operation::add_id(pOVar12,this_00->id);
              Converter::Impl::add(impl,pOVar12,false);
              pTVar8 = local_1060;
              Converter::Impl::rewrite_value(impl,(Value *)instruction,pOVar12->id);
            }
          }
          op = local_104c;
          if (local_104c != OpNop) {
            IVar3 = Converter::Impl::get_type_id(impl,pTVar8,0);
            IVar3 = spv::Builder::makeVectorType(this,IVar3,local_1068);
            pOVar12 = Converter::Impl::allocate(impl,op,IVar3);
            IVar3 = Converter::Impl::get_id_for_value(impl,(Value *)instruction,0);
            Operation::add_id(pOVar12,IVar3);
            Converter::Impl::add(impl,pOVar12,false);
            Converter::Impl::rewrite_value(impl,(Value *)instruction,pOVar12->id);
          }
          build_exploded_composite_from_vector(impl,&instruction->super_Instruction,4);
        }
        bVar1 = true;
      }
    }
    else {
      p_Var9 = get_thread_log_callback();
      if (p_Var9 == (LoggingCallback)0x0) {
        emit_cbuffer_load_legacy_instruction();
      }
      else {
        builtin_strncpy(local_1028 + 0x10,"ust be struct.\n",0x10);
        builtin_strncpy(local_1028,"y: return type m",0x10);
        local_1038._M_array = (iterator)0x4c72656666754243;
        local_1038._M_len._0_1_ = 'o';
        local_1038._M_len._1_1_ = 'a';
        local_1038._M_len._2_1_ = 'd';
        local_1038._M_len._3_1_ = 'L';
        local_1038._M_len._4_1_ = 'e';
        local_1038._M_len._5_1_ = 'g';
        local_1038._M_len._6_1_ = 'a';
        local_1038._M_len._7_1_ = 'c';
        pvVar10 = get_thread_log_callback_userdata();
        (*p_Var9)(pvVar10,Error,(char *)&local_1038);
      }
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool emit_cbuffer_load_legacy_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	// This function returns a struct, but ignore that, and just return a vec4 for now.
	// extractvalue is used to pull out components and that works for vectors as well.
	spv::Id ptr_id = impl.get_id_for_value(instruction->getOperand(1));
	if (!ptr_id)
		return false;

	if (ptr_id == impl.root_constant_id)
	{
		return emit_cbuffer_load_root_constant(impl, instruction);
	}
	else
	{
		auto &meta = impl.handle_to_resource_meta[ptr_id];

		auto *result_type = instruction->getType();

		if (result_type->getTypeID() != llvm::Type::TypeID::StructTyID)
		{
			LOGE("CBufferLoadLegacy: return type must be struct.\n");
			return false;
		}

		emit_buffer_synchronization_validation(impl, instruction, BDAOperation::Load);

		if (meta.storage == spv::StorageClassPhysicalStorageBuffer)
		{
			return emit_cbuffer_load_physical_pointer(impl, instruction);
		}
		else if (meta.storage == spv::StorageClassShaderRecordBufferKHR)
		{
			return emit_cbuffer_load_shader_record(impl, instruction,
			                                       impl.handle_to_root_member_offset[instruction->getOperand(1)]);
		}

		// Handle min16float where we want FP16 value, but FP32 physical.
		auto *result_component_type = result_type->getStructElementType(0);
		spv::Op value_cast_op = spv::OpNop;
		spv::Id physical_type_id = 0;
		get_physical_load_store_cast_info(impl, result_component_type, physical_type_id, value_cast_op);

		RawVecSize alias_vecsize;
		RawWidth alias_width;
		unsigned scalar_alignment = get_type_scalar_alignment(impl, result_component_type);
		unsigned bits, vecsize;

		if (scalar_alignment == 8)
		{
			alias_width = RawWidth::B64;
			alias_vecsize = RawVecSize::V2;
		}
		else
		{
			alias_width = RawWidth::B32;
			alias_vecsize = RawVecSize::V4;
		}

		bits = raw_width_to_bits(alias_width);
		vecsize = raw_vecsize_to_vecsize(alias_vecsize);

		RawType raw_type = result_component_type->getTypeID() == llvm::Type::TypeID::IntegerTyID &&
		                   scalar_alignment == 8 ? RawType::Integer : RawType::Float;

		ptr_id = get_buffer_alias_handle(impl, meta, ptr_id, raw_type, alias_width, alias_vecsize);

		spv::Id vec4_index = impl.get_id_for_value(instruction->getOperand(2));

		spv::Id element_type_id = raw_type == RawType::Integer ?
		                          builder.makeUintType(bits) : builder.makeFloatType(bits);

		spv::Id vector_type_id = builder.makeVectorType(element_type_id, vecsize);
		Operation *access_chain_op = impl.allocate(spv::OpAccessChain, builder.makePointer(meta.storage, vector_type_id));
		access_chain_op->add_ids({ ptr_id, builder.makeUintConstant(0), vec4_index });
		impl.add(access_chain_op);

		if (meta.non_uniform)
			builder.addDecoration(access_chain_op->id, spv::DecorationNonUniformEXT);

		bool need_bitcast = false;
		if (result_type->getStructElementType(0)->getTypeID() == llvm::Type::TypeID::IntegerTyID && scalar_alignment < 8)
			need_bitcast = true;

		Operation *load_op = impl.allocate(spv::OpLoad, instruction, vector_type_id);
		load_op->add_id(access_chain_op->id);
		impl.add(load_op);

		if (scalar_alignment == 2)
		{
			// Special case, need to bitcast and build a struct with 8 elements instead.
			if (!build_bitcast_32x4_to_16x8_composite(impl, instruction, load_op->id))
				return false;
		}
		else if (need_bitcast)
		{
			spv::Id uint_vector_type_id = builder.makeVectorType(builder.makeUintType(bits), vecsize);
			Operation *op = impl.allocate(spv::OpBitcast, uint_vector_type_id);

			op->add_id(load_op->id);
			impl.add(op);
			impl.rewrite_value(instruction, op->id);
		}

		// If we have min-precision loads, we might have to truncate here.
		if (value_cast_op != spv::OpNop)
		{
			auto *cast_op = impl.allocate(value_cast_op, builder.makeVectorType(impl.get_type_id(result_component_type), vecsize));
			cast_op->add_id(impl.get_id_for_value(instruction));
			impl.add(cast_op);
			impl.rewrite_value(instruction, cast_op->id);
		}

		build_exploded_composite_from_vector(impl, instruction, 4);
	}

	return true;
}